

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path_test.cpp
# Opt level: O3

void __thiscall
portability_path_test_portability_path_test_get_path_of_filepath_Test::
~portability_path_test_portability_path_test_get_path_of_filepath_Test
          (portability_path_test_portability_path_test_get_path_of_filepath_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(portability_path_test, portability_path_test_get_path_of_filepath)
{
	static const char base[] = "/a/b/c/asd";
	static const char result[] = "/a/b/c/";

	string_path path;

	size_t size = portability_path_get_directory(base, sizeof(base), path, PATH_SIZE);

	EXPECT_EQ((int)0, (int)strcmp(path, result));
	EXPECT_EQ((size_t)size, (size_t)sizeof(result));
	EXPECT_EQ((char)'\0', (char)result[size - 1]);
}